

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O0

void __thiscall IntersectionHelper::intersect(IntersectionHelper *this)

{
  IntersectionHelper *in_RDI;
  bool bVar1;
  
  intersect_by_8(in_RDI);
  while( true ) {
    bVar1 = false;
    if (in_RDI->run_it_ < in_RDI->run_end_) {
      bVar1 = in_RDI->seq_it_ < in_RDI->seq_end_;
    }
    if (!bVar1) break;
    step_single(in_RDI);
  }
  return;
}

Assistant:

void IntersectionHelper::intersect() {
    intersect_by_8();
    while (run_it_ < run_end_ && seq_it_ < seq_end_) {
        step_single();
    }
}